

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QStyleSheetBorderImageData>::detach_helper
          (QSharedDataPointer<QStyleSheetBorderImageData> *this)

{
  QStyleSheetBorderImageData *pQVar1;
  undefined8 uVar2;
  TileMode TVar3;
  QStyleSheetBorderImageData *pQVar4;
  
  pQVar4 = (QStyleSheetBorderImageData *)operator_new(0x50);
  pQVar1 = (this->d).ptr;
  (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  uVar2 = *(undefined8 *)(pQVar1->cuts + 2);
  *(undefined8 *)pQVar4->cuts = *(undefined8 *)pQVar1->cuts;
  *(undefined8 *)(pQVar4->cuts + 2) = uVar2;
  QPixmap::QPixmap(&pQVar4->pixmap,&pQVar1->pixmap);
  QImage::QImage(&pQVar4->image,&pQVar1->image);
  TVar3 = pQVar1->vertStretch;
  pQVar4->horizStretch = pQVar1->horizStretch;
  pQVar4->vertStretch = TVar3;
  LOCK();
  (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> == 0) {
    pQVar1 = (this->d).ptr;
    if (pQVar1 != (QStyleSheetBorderImageData *)0x0) {
      QImage::~QImage(&pQVar1->image);
      QPixmap::~QPixmap(&pQVar1->pixmap);
    }
    operator_delete(pQVar1,0x50);
  }
  (this->d).ptr = pQVar4;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}